

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode(lzh_stream *strm,wchar_t last)

{
  int *piVar1;
  long lVar2;
  long in_RDI;
  wchar_t r;
  int64_t avail_in;
  lzh_dec *ds;
  wchar_t in_stack_00000054;
  lzh_stream *in_stack_00000058;
  wchar_t local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  piVar1 = *(int **)(in_RDI + 0x30);
  if (piVar1[0x55] == 0) {
    lVar2 = *(long *)(in_RDI + 8);
    do {
      if (*piVar1 < 9) {
        local_2c = lzh_read_blocks((lzh_stream *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   (wchar_t)((ulong)in_RDI >> 0x20));
      }
      else {
        local_2c = lzh_decode_blocks(in_stack_00000058,in_stack_00000054);
      }
    } while (local_2c == L'd');
    *(long *)(in_RDI + 0x10) = (lVar2 - *(long *)(in_RDI + 8)) + *(long *)(in_RDI + 0x10);
  }
  else {
    local_2c = piVar1[0x55];
  }
  return local_2c;
}

Assistant:

static int
lzh_decode(struct lzh_stream *strm, int last)
{
	struct lzh_dec *ds = strm->ds;
	int64_t avail_in;
	int r;

	if (ds->error)
		return (ds->error);

	avail_in = strm->avail_in;
	do {
		if (ds->state < ST_GET_LITERAL)
			r = lzh_read_blocks(strm, last);
		else
			r = lzh_decode_blocks(strm, last);
	} while (r == 100);
	strm->total_in += avail_in - strm->avail_in;
	return (r);
}